

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineBuffer.cpp
# Opt level: O2

void __thiscall yb::LineBuffer::LineBuffer(LineBuffer *this,size_t size)

{
  (this->buffer_)._M_dataplus._M_p = (pointer)&(this->buffer_).field_2;
  (this->buffer_)._M_string_length = 0;
  (this->buffer_).field_2._M_local_buf[0] = '\0';
  (this->position_)._M_current = (char *)0x0;
  std::__cxx11::string::reserve((ulong)this);
  (this->position_)._M_current = (this->buffer_)._M_dataplus._M_p;
  return;
}

Assistant:

LineBuffer::LineBuffer(size_t size) {
    buffer_.reserve(size);
    position_ = buffer_.begin();
}